

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O1

float __thiscall IceMaths::Matrix4x4::CoFactor(Matrix4x4 *this,udword row,udword col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  
  uVar9 = (row + 1 & 3) << 4;
  uVar10 = (ulong)((col + 1 & 3) << 2);
  fVar15 = *(float *)((long)this->m[0] + uVar10 + uVar9);
  uVar11 = (row & 3 ^ 2) << 4;
  uVar12 = (ulong)((col & 3 ^ 2) << 2);
  fVar1 = *(float *)((long)this->m[0] + uVar12 + uVar11);
  uVar13 = (row - 1 & 3) << 4;
  uVar14 = (ulong)((col - 1 & 3) << 2);
  fVar2 = *(float *)((long)this->m[0] + uVar12 + uVar9);
  fVar3 = *(float *)((long)this->m[0] + uVar14 + uVar11);
  fVar4 = *(float *)((long)this->m[0] + uVar12 + uVar13);
  fVar5 = *(float *)((long)this->m[0] + uVar14 + uVar13);
  fVar6 = *(float *)((long)this->m[0] + uVar10 + uVar13);
  fVar7 = *(float *)((long)this->m[0] + uVar14 + uVar9);
  fVar8 = *(float *)((long)this->m[0] + uVar10 + uVar11);
  fVar15 = (fVar7 * fVar8 * fVar4 + fVar15 * fVar1 * fVar5 + fVar2 * fVar3 * fVar6) -
           (fVar5 * fVar8 * fVar2 + fVar1 * fVar6 * fVar7 + fVar3 * fVar4 * fVar15);
  if ((col + row & 1) != 0) {
    fVar15 = -fVar15;
  }
  return fVar15;
}

Assistant:

float Matrix4x4::CoFactor(udword row, udword col) const
{
	return	 (( m[(row+1)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+3)&3][(col+3)&3] +
				m[(row+1)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+3)&3][(col+1)&3] +
				m[(row+1)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+3)&3][(col+2)&3])
			-  (m[(row+3)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+1)&3][(col+3)&3] +
				m[(row+3)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+1)&3][(col+1)&3] +
				m[(row+3)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+1)&3][(col+2)&3])) * ((row + col) & 1 ? -1.0f : +1.0f);
}